

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateSerializationCode
          (MessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  char *text;
  
  TVar1 = FieldDescriptor::type((this->super_FieldGeneratorBase).descriptor_);
  text = 
  "if ($has_property_check$) {\n  output.WriteRawTag($tag_bytes$);\n  output.WriteGroup($property_name$);\n  output.WriteRawTag($end_tag_bytes$);\n}\n"
  ;
  if (TVar1 == TYPE_MESSAGE) {
    text = 
    "if ($has_property_check$) {\n  output.WriteRawTag($tag_bytes$);\n  output.WriteMessage($property_name$);\n}\n"
    ;
  }
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateSerializationCode(io::Printer* printer) {
  if (descriptor_->type() == FieldDescriptor::Type::TYPE_MESSAGE) {
    printer->Print(
      variables_,
      "if ($has_property_check$) {\n"
      "  output.WriteRawTag($tag_bytes$);\n"
      "  output.WriteMessage($property_name$);\n"
      "}\n");
  } else {
    printer->Print(
      variables_,
      "if ($has_property_check$) {\n"
      "  output.WriteRawTag($tag_bytes$);\n"
      "  output.WriteGroup($property_name$);\n"
      "  output.WriteRawTag($end_tag_bytes$);\n"
      "}\n");
  }
}